

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O3

Qiniu_Error
Qiniu_RS_BatchChangeType
          (Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryChangeType *entries,
          Qiniu_ItemCount entryCount)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar6;
  Qiniu_Int64 QVar7;
  int *piVar8;
  long lVar10;
  ulong uVar11;
  Qiniu_Error QVar12;
  cJSON *root;
  char *rsHost;
  undefined8 local_58;
  char *local_50;
  Qiniu_Client *local_48;
  Qiniu_RS_BatchItemRet *local_40;
  char *local_38;
  char *pcVar9;
  
  local_40 = rets;
  QVar12 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&local_38);
  pcVar9 = QVar12.message;
  uVar1 = QVar12.code;
  if (uVar1 == 200) {
    local_48 = self;
    local_50 = Qiniu_String_Concat2(local_38,"/batch");
    if (entryCount < 1) {
      pcVar3 = (char *)0x0;
    }
    else {
      lVar10 = 0;
      pcVar9 = (char *)0x0;
      do {
        pcVar3 = Qiniu_String_Concat3
                           (*(char **)((long)&entries->bucket + lVar10),":",
                            *(char **)((long)&entries->key + lVar10));
        pcVar4 = Qiniu_String_Encode(pcVar3);
        local_58._0_4_ = 0;
        uVar11 = (ulong)*(uint *)((long)&entries->fileType + lVar10);
        if (uVar11 < 5) {
          pcVar5 = *(char **)(&DAT_00124ce0 + uVar11 * 8);
        }
        else {
          pcVar5 = (char *)&local_58;
          snprintf(pcVar5,4,"%d");
        }
        pcVar5 = Qiniu_String_Concat(pcVar4,"/type/",pcVar5,0);
        s3 = Qiniu_String_Concat2("op=/chtype/",pcVar5);
        Qiniu_Free(pcVar3);
        Qiniu_Free(pcVar4);
        Qiniu_Free(pcVar5);
        pcVar3 = s3;
        if (pcVar9 != (char *)0x0) {
          pcVar3 = Qiniu_String_Concat3(pcVar9,"&",s3);
          free(s3);
        }
        free(pcVar9);
        lVar10 = lVar10 + 0x18;
        pcVar9 = pcVar3;
      } while ((ulong)(uint)entryCount * 0x18 != lVar10);
    }
    bodyLen = strlen(pcVar3);
    pcVar4 = local_50;
    QVar12 = Qiniu_Client_CallWithBuffer
                       (local_48,(Qiniu_Json **)&local_58,local_50,pcVar3,bodyLen,
                        "application/x-www-form-urlencoded");
    pcVar9 = QVar12.message;
    uVar1 = QVar12.code;
    free(pcVar4);
    free(pcVar3);
    uVar2 = cJSON_GetArraySize((cJSON *)CONCAT44(local_58._4_4_,(undefined4)local_58));
    if (0 < (int)uVar2) {
      piVar8 = &local_40->code;
      uVar11 = 0;
      do {
        pcVar6 = cJSON_GetArrayItem((cJSON *)CONCAT44(local_58._4_4_,(undefined4)local_58),
                                    (int)uVar11);
        QVar7 = Qiniu_Json_GetInt64(pcVar6,"code",0);
        pcVar6 = cJSON_GetObjectItem(pcVar6,"data");
        *piVar8 = (int)QVar7;
        if ((int)QVar7 != 200) {
          pcVar3 = Qiniu_Json_GetString(pcVar6,"error",(char *)0x0);
          ((Qiniu_RS_BatchItemRet *)(piVar8 + -2))->error = pcVar3;
        }
        uVar11 = uVar11 + 1;
        piVar8 = piVar8 + 4;
      } while (uVar2 != uVar11);
    }
  }
  QVar12._4_4_ = 0;
  QVar12.code = uVar1;
  QVar12.message = pcVar9;
  return QVar12;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchChangeType(Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
                                     Qiniu_RS_EntryChangeType *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *opBody, *bodyPart;

    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryChangeType *entry = entries;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);

        char *fileType = NULL, buf[4] = {0};
        switch (entry->fileType)
        {
        case QINIU_FILE_TYPE_STANDARD:
            fileType = "0";
            break;
        case QINIU_FILE_TYPE_IA:
            fileType = "1";
            break;
        case QINIU_FILE_TYPE_ARCHIVE:
            fileType = "2";
            break;
        case QINIU_FILE_TYPE_DEEP_ARCHIVE:
            fileType = "3";
            break;
        case QINIU_FILE_TYPE_ARCHIVE_IR:
            fileType = "4";
            break;
        default:
            snprintf(buf, sizeof(buf), "%d", entry->fileType);
            fileType = &buf[0];
            break;
        }

        bodyPart = Qiniu_String_Concat(entryURIEncoded, "/type/", fileType, NULL);
        opBody = Qiniu_String_Concat2("op=/chtype/", bodyPart);
        Qiniu_Free(entryURI);
        Qiniu_Free(entryURIEncoded);
        Qiniu_Free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}